

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O2

void fmt::v7::
     print<std::basic_string_view<char,std::char_traits<char>>,int_const&,int_const&,double_const&,double_const&,double_const&,char>
               (FILE *f,basic_string_view<char,_std::char_traits<char>_> *format_str,int *args,
               int *args_1,double *args_2,double *args_3,double *args_4)

{
  format_args args_00;
  string_view format_str_00;
  ulong local_58 [2];
  ulong local_48;
  double local_38;
  double local_28;
  double local_18;
  
  local_38 = *args_2;
  local_58[0] = (ulong)(uint)*args;
  local_48 = (ulong)(uint)*args_1;
  local_28 = *args_3;
  local_18 = *args_4;
  args_00.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.values_ =
       (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_> *)
       local_58;
  args_00.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = 0xaaa11;
  format_str_00.size_ = format_str->_M_len;
  format_str_00.data_ = format_str->_M_str;
  vprint(f,format_str_00,args_00);
  return;
}

Assistant:

inline void print(std::FILE* f, const S& format_str, Args&&... args) {
  const auto& vargs = fmt::make_args_checked<Args...>(format_str, args...);
  return detail::is_unicode<Char>()
             ? vprint(f, to_string_view(format_str), vargs)
             : detail::vprint_mojibake(f, to_string_view(format_str), vargs);
}